

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86emithelper.cpp
# Opt level: O0

Error __thiscall asmjit::v1_14::x86::EmitHelper::emitProlog(EmitHelper *this,FuncFrame *frame)

{
  bool bVar1;
  Error EVar2;
  FuncAttributes *in_RSI;
  long in_RDI;
  Error _err_10;
  Error _err_9;
  uint32_t xSize;
  uint32_t xInst;
  Reg xReg;
  BitWordIterator<unsigned_int> it_1;
  RegGroup group;
  Iterator __end3;
  Iterator __begin3;
  EnumValues<asmjit::v1_14::RegGroup,_(asmjit::v1_14::RegGroup)1,_(asmjit::v1_14::RegGroup)3>
  *__range3;
  Mem xBase;
  Error _err_8;
  Mem saMem;
  Error _err_7;
  Error _err_6;
  Error _err_5;
  Error _err_4;
  uint32_t saRegId;
  Error _err_3;
  BitWordIterator<unsigned_int> it;
  Error _err_2;
  Error _err_1;
  Error _err;
  InstId instId;
  Gp saReg;
  Gp gpReg;
  Gp zbp;
  Gp zsp;
  uint32_t gpSaved;
  Emitter *emitter;
  undefined4 in_stack_fffffffffffff968;
  InstId in_stack_fffffffffffff96c;
  undefined4 in_stack_fffffffffffff970;
  undefined4 in_stack_fffffffffffff974;
  int in_stack_fffffffffffff978;
  InstId in_stack_fffffffffffff97c;
  BaseEmitter *in_stack_fffffffffffff980;
  RegMask local_670;
  char local_66c;
  char local_66b;
  char local_66a [2];
  uint32_t *xSize_00;
  uint32_t *in_stack_fffffffffffff9a0;
  undefined4 uVar3;
  Reg *in_stack_fffffffffffff9a8;
  int iVar4;
  undefined4 in_stack_fffffffffffff9b0;
  uint in_stack_fffffffffffff9b4;
  RegGroup in_stack_fffffffffffff9bf;
  FuncAttributes local_63c [4];
  undefined4 local_62c;
  undefined4 local_628;
  int local_624 [4];
  int local_614;
  undefined4 local_610;
  undefined4 local_60c;
  undefined4 local_608;
  uint local_604;
  undefined4 local_600;
  uint local_5fc;
  undefined4 local_5f8;
  Error local_5f4;
  undefined4 local_5f0;
  undefined4 local_5ec;
  undefined4 local_5e8;
  ulong local_5e4;
  undefined8 local_5dc;
  undefined8 local_5d4;
  undefined8 local_5cc;
  EmitterExplicitT<asmjit::v1_14::x86::Emitter> local_5c4 [16];
  uint local_5b4;
  undefined4 uStack_5b0;
  undefined8 local_5ac;
  RegMask local_5a4;
  long local_5a0;
  FuncAttributes *local_598;
  long local_580;
  uint *local_578;
  undefined8 *local_570;
  uint *local_568;
  undefined8 *local_560;
  uint *local_558;
  ulong *local_550;
  uint *local_548;
  ulong *local_540;
  FuncAttributes *local_538;
  long local_530;
  long local_528;
  undefined4 local_51c;
  long local_518;
  FuncAttributes *local_510;
  FuncAttributes *local_508;
  undefined4 *local_500;
  uint local_4f4;
  uint *local_4f0;
  RegMask local_4e4;
  RegMask *local_4e0;
  RegMask *local_4d8;
  RegMask *local_4d0;
  uint *local_4c8;
  uint32_t local_4bc;
  undefined1 *local_4b8;
  uint local_4ac;
  ulong *local_4a8;
  uint32_t local_49c;
  undefined8 *local_498;
  FuncAttributes *local_490;
  FuncAttributes *local_488;
  FuncAttributes *local_480;
  FuncAttributes *local_478;
  undefined4 local_470;
  undefined4 local_46c;
  undefined4 local_468;
  undefined4 local_464;
  int *local_460;
  int *local_458;
  FuncAttributes *local_450;
  FuncAttributes *local_448;
  undefined4 local_440;
  undefined4 local_43c;
  undefined4 local_438;
  undefined4 local_434;
  FuncAttributes *local_430;
  FuncAttributes *local_428;
  FuncAttributes *local_420;
  undefined4 local_414;
  undefined4 local_410;
  FuncAttributes local_40c;
  uint *local_408;
  undefined1 *local_400;
  undefined4 local_3f4;
  undefined4 local_3f0;
  FuncAttributes local_3ec;
  uint *local_3e8;
  undefined1 *local_3e0;
  FuncAttributes *local_3d8;
  FuncAttributes *local_3d0;
  uint32_t *local_3c8;
  undefined1 local_3b9;
  uint32_t *local_3b8;
  undefined1 local_3a9;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  undefined4 local_38c;
  undefined1 *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  InstId local_36c;
  long local_368;
  int local_35c;
  undefined1 *local_358;
  char *local_350;
  uint *local_348;
  ulong *local_340;
  uint *local_338;
  undefined8 *local_330;
  undefined4 local_328;
  undefined4 local_324;
  undefined4 local_320;
  undefined4 local_31c;
  undefined4 *local_318;
  undefined4 *local_310;
  undefined4 local_304;
  undefined4 *local_300;
  undefined4 *local_2f8;
  undefined4 local_2f0;
  undefined4 local_2ec;
  FuncAttributes *local_2e8;
  undefined4 local_2dc;
  FuncAttributes *local_2d8;
  undefined4 local_2cc;
  FuncAttributes *local_2c8;
  byte *local_2c0;
  byte local_2b1;
  undefined4 *local_2b0;
  undefined4 local_2a8;
  undefined4 local_2a4;
  undefined4 local_2a0;
  undefined4 local_29c;
  ulong local_298;
  long local_290;
  ulong local_288;
  long local_280;
  undefined4 local_274;
  FuncAttributes local_270;
  undefined4 local_26c;
  undefined4 *local_268;
  FuncAttributes *local_260;
  int local_254;
  int local_250;
  undefined4 local_24c;
  undefined4 *local_248;
  int *local_240;
  undefined4 local_238;
  uint local_234 [3];
  uint local_228;
  uint local_224 [2];
  FuncAttributes local_21c;
  uint *local_218;
  undefined1 *local_210;
  undefined4 local_204;
  uint *local_200;
  uint *local_1f8;
  uint *local_1f0;
  undefined4 local_1e8;
  undefined4 local_1e4;
  undefined4 *local_1e0;
  uint *local_1d8;
  uint local_1cc;
  undefined4 *local_1c8;
  uint *local_1c0;
  uint local_1b4;
  uint *local_1b0;
  uint *local_1a8;
  uint local_19c;
  undefined4 local_198;
  uint local_194 [3];
  uint local_188;
  uint local_184 [2];
  FuncAttributes local_17c;
  uint *local_178;
  undefined1 *local_170;
  undefined4 local_164;
  uint *local_160;
  uint *local_158;
  uint *local_150;
  undefined4 local_148;
  undefined4 local_144;
  undefined4 *local_140;
  uint *local_138;
  uint local_12c;
  undefined4 *local_128;
  uint *local_120;
  uint local_114;
  uint *local_110;
  uint *local_108;
  uint local_fc;
  byte local_f5;
  uint local_f4;
  byte local_ed;
  uint local_ec;
  undefined4 local_e8;
  undefined4 local_e4;
  undefined4 local_e0;
  undefined4 local_dc;
  uint *local_d8;
  uint *local_d0;
  FuncAttributes local_c4;
  undefined4 local_c0;
  uint *local_b8;
  undefined1 *local_b0;
  FuncAttributes local_a4;
  undefined4 local_a0;
  uint *local_98;
  undefined1 *local_90;
  FuncAttributes local_84;
  undefined4 local_80;
  uint *local_78;
  undefined1 *local_70;
  FuncAttributes local_64;
  undefined4 local_60;
  uint *local_58;
  undefined1 *local_50;
  undefined4 local_44;
  undefined4 *local_40;
  undefined1 *local_38;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_5a0 = *(long *)(in_RDI + 8);
  local_598 = in_RSI;
  local_580 = local_5a0;
  local_5a4 = FuncFrame::savedRegs
                        ((FuncFrame *)CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978),
                         (RegGroup)((uint)in_stack_fffffffffffff974 >> 0x18));
  EmitterExplicitT<asmjit::v1_14::x86::Emitter>::zsp
            ((EmitterExplicitT<asmjit::v1_14::x86::Emitter> *)&local_5b4);
  EmitterExplicitT<asmjit::v1_14::x86::Emitter>::zbp(local_5c4);
  local_570 = &local_5d4;
  local_578 = &local_5b4;
  local_5d4 = CONCAT44(uStack_5b0,local_5b4);
  local_5cc = local_5ac;
  local_550 = &local_5e4;
  local_558 = &local_5b4;
  local_5e4 = CONCAT44(uStack_5b0,local_5b4);
  local_5dc = local_5ac;
  local_538 = local_598;
  local_2c8 = local_598;
  local_2cc = 0x80;
  local_568 = local_578;
  local_560 = local_570;
  local_548 = local_558;
  local_540 = local_550;
  local_348 = local_558;
  local_340 = local_550;
  local_338 = local_578;
  local_330 = local_570;
  bVar1 = Support::test<asmjit::v1_14::FuncAttributes,asmjit::v1_14::FuncAttributes>
                    (*local_598,kIndirectBranchProtection);
  if (bVar1) {
    local_530 = local_5a0;
    local_528 = local_5a0;
    local_2c0 = (byte *)(local_5a0 + 0x48);
    local_2b1 = *local_2c0;
    local_5e8 = 0xb1;
    if ((local_2b1 & 1) == 1) {
      local_5e8 = 0xb0;
    }
    local_518 = local_5a0;
    local_51c = local_5e8;
    EVar2 = BaseEmitter::_emitI((BaseEmitter *)
                                CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
                                in_stack_fffffffffffff96c);
    if (EVar2 != 0) {
      return EVar2;
    }
    local_5ec = 0;
  }
  local_508 = local_598;
  local_2e8 = local_598;
  local_2ec = 0x10;
  bVar1 = Support::test<asmjit::v1_14::FuncAttributes,asmjit::v1_14::FuncAttributes>
                    (*local_598,kHasPreservedFP);
  if (bVar1) {
    local_5f0 = 5;
    local_500 = &local_5f0;
    local_5a4 = local_5a4 & 0xffffffdf;
    local_2b0 = local_500;
    local_5f4 = EmitterExplicitT<asmjit::v1_14::x86::Emitter>::push
                          ((EmitterExplicitT<asmjit::v1_14::x86::Emitter> *)
                           CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
                           (Gp *)0x1cc859);
    if (local_5f4 != 0) {
      return local_5f4;
    }
    EVar2 = EmitterExplicitT<asmjit::v1_14::x86::Emitter>::mov
                      ((EmitterExplicitT<asmjit::v1_14::x86::Emitter> *)
                       CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978),
                       (Gp *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
                       (Gp *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
    if (EVar2 != 0) {
      return EVar2;
    }
    local_5f8 = 0;
  }
  local_4f0 = &local_5fc;
  local_4f4 = local_5a4;
  local_5fc = local_5a4;
  while (local_4c8 = &local_5fc, local_5fc != 0) {
    local_49c = Support::BitWordIterator<unsigned_int>::next
                          ((BitWordIterator<unsigned_int> *)
                           CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
    local_498 = &local_5d4;
    local_5d4 = CONCAT44(local_49c,(undefined4)local_5d4);
    EVar2 = EmitterExplicitT<asmjit::v1_14::x86::Emitter>::push
                      ((EmitterExplicitT<asmjit::v1_14::x86::Emitter> *)
                       CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),(Gp *)0x1cc977)
    ;
    if (EVar2 != 0) {
      return EVar2;
    }
    local_600 = 0;
  }
  local_490 = local_598;
  local_604 = (uint)*(byte *)((long)local_598 + 6);
  if ((local_604 != 0xff) && (local_604 != 4)) {
    local_4a8 = &local_5e4;
    local_5e4 = (ulong)CONCAT14(*(byte *)((long)local_598 + 6),(undefined4)local_5e4);
    local_510 = local_598;
    local_2d8 = local_598;
    local_2dc = 0x10;
    local_4ac = local_604;
    bVar1 = Support::test<asmjit::v1_14::FuncAttributes,asmjit::v1_14::FuncAttributes>
                      (*local_598,kHasPreservedFP);
    if (bVar1) {
      if (local_604 != 5) {
        EVar2 = EmitterExplicitT<asmjit::v1_14::x86::Emitter>::mov
                          ((EmitterExplicitT<asmjit::v1_14::x86::Emitter> *)
                           CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978),
                           (Gp *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
                           (Gp *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
        if (EVar2 != 0) {
          return EVar2;
        }
        local_608 = 0;
      }
    }
    else {
      EVar2 = EmitterExplicitT<asmjit::v1_14::x86::Emitter>::mov
                        ((EmitterExplicitT<asmjit::v1_14::x86::Emitter> *)
                         CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978),
                         (Gp *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
                         (Gp *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
      if (EVar2 != 0) {
        return EVar2;
      }
      local_60c = 0;
    }
  }
  local_480 = local_598;
  if (*(byte *)((long)local_598 + 10) <= *(byte *)((long)local_598 + 0xd)) {
    local_478 = local_598;
    local_624[0] = -(uint)*(byte *)((long)local_598 + 0xd);
    local_458 = local_624 + 1;
    local_460 = local_624;
    local_464 = 0;
    local_320 = 4;
    local_31c = 4;
    local_46c = 4;
    local_2a0 = 0;
    local_470 = 0;
    local_2f8 = &local_46c;
    local_300 = &local_470;
    local_468 = 4;
    local_290 = (long)local_624[0];
    local_280 = (long)local_624[0];
    local_248 = &local_468;
    local_24c = 0;
    local_254 = local_624[0] >> 0x1f;
    local_624[1] = 4;
    local_624[2] = 0;
    local_2f0 = local_468;
    local_29c = local_470;
    local_250 = local_624[0];
    local_240 = local_458;
    local_624[3] = local_624[0];
    local_614 = local_254;
    EVar2 = EmitterExplicitT<asmjit::v1_14::x86::Emitter>::and_
                      ((EmitterExplicitT<asmjit::v1_14::x86::Emitter> *)
                       CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978),
                       (Gp *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
                       (Imm *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
    if (EVar2 != 0) {
      return EVar2;
    }
    local_610 = 0;
  }
  local_450 = local_598;
  if (local_598[0xb] != kNoAttributes) {
    local_448 = local_598;
    local_63c[0] = local_598[0xb];
    local_428 = local_63c + 1;
    local_430 = local_63c;
    local_434 = 0;
    local_328 = 4;
    local_324 = 4;
    local_43c = 4;
    local_2a8 = 0;
    local_440 = 0;
    local_310 = &local_43c;
    local_318 = &local_440;
    local_438 = 4;
    local_298 = (ulong)local_63c[0];
    local_288 = (ulong)local_63c[0];
    local_268 = &local_438;
    local_26c = 0;
    local_274 = 0;
    local_63c[1] = 4;
    local_63c[2] = 0;
    local_62c = 0;
    local_304 = local_438;
    local_2a4 = local_440;
    local_270 = local_63c[0];
    local_260 = local_428;
    local_63c[3] = local_63c[0];
    EVar2 = EmitterExplicitT<asmjit::v1_14::x86::Emitter>::sub
                      ((EmitterExplicitT<asmjit::v1_14::x86::Emitter> *)
                       CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978),
                       (Gp *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
                       (Imm *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
    if (EVar2 != 0) {
      return EVar2;
    }
    local_628 = 0;
  }
  local_488 = local_598;
  if ((*(byte *)((long)local_598 + 10) <= *(byte *)((long)local_598 + 0xd)) &&
     (local_420 = local_598, local_598[8] != ~kNoAttributes)) {
    local_3d8 = local_598;
    local_3ec = local_598[8];
    local_3e0 = &stack0xfffffffffffff9b4;
    local_3e8 = &local_5b4;
    local_3f0 = 0;
    local_3f4 = 0;
    local_204 = 0;
    local_210 = &stack0xfffffffffffff9b4;
    local_224[1] = 0;
    local_1e8 = 2;
    local_1e4 = 2;
    local_234[1] = 2;
    local_ed = (byte)(local_5b4 >> 3) & 0x1f;
    local_234[0] = (uint)local_ed << 3;
    local_1a8 = local_234 + 1;
    local_1b0 = local_234;
    in_stack_fffffffffffff9b4 = local_234[0] | 2;
    local_e0 = 0;
    local_238 = 0;
    local_1c0 = local_234 + 2;
    local_1c8 = &local_238;
    local_1d8 = &local_228;
    local_1e0 = &local_204;
    local_78 = local_224;
    local_80 = 0;
    local_60 = 0;
    in_stack_fffffffffffff9bf = k0;
    local_234[2] = in_stack_fffffffffffff9b4;
    local_228 = in_stack_fffffffffffff9b4;
    local_224[0] = in_stack_fffffffffffff9b4;
    local_21c = local_3ec;
    local_218 = local_3e8;
    local_200 = local_3e8;
    local_1f8 = local_3e8;
    local_1f0 = local_3e8;
    local_1cc = in_stack_fffffffffffff9b4;
    local_1b4 = in_stack_fffffffffffff9b4;
    local_19c = in_stack_fffffffffffff9b4;
    local_ec = local_234[0];
    local_dc = local_238;
    local_d0 = local_3e8;
    local_84 = local_3ec;
    local_70 = local_210;
    local_64 = local_3ec;
    local_58 = local_78;
    local_50 = local_210;
    EVar2 = EmitterExplicitT<asmjit::v1_14::x86::Emitter>::mov
                      ((EmitterExplicitT<asmjit::v1_14::x86::Emitter> *)
                       CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978),
                       (Mem *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
                       (Gp *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
    if (EVar2 != 0) {
      return EVar2;
    }
    in_stack_fffffffffffff9b0 = 0;
  }
  local_3d0 = local_598;
  local_40c = local_598[0x18];
  local_400 = &stack0xfffffffffffff9a0;
  local_408 = &local_5b4;
  local_410 = 0;
  local_414 = 0;
  local_164 = 0;
  local_170 = &stack0xfffffffffffff9a0;
  local_184[1] = 0;
  local_148 = 2;
  local_144 = 2;
  local_194[1] = 2;
  local_f5 = (byte)(local_5b4 >> 3) & 0x1f;
  local_194[0] = (uint)local_f5 << 3;
  local_108 = local_194 + 1;
  local_110 = local_194;
  local_194[2] = local_194[0] | 2;
  local_e8 = 0;
  local_198 = 0;
  local_120 = local_194 + 2;
  local_128 = &local_198;
  local_138 = &local_188;
  local_140 = &local_164;
  local_b8 = local_184;
  local_c0 = 0;
  local_a0 = 0;
  uVar3 = 0;
  xSize_00 = (uint32_t *)(local_66a + 1);
  local_3b9 = 1;
  local_66a[0] = '\x01';
  local_3a9 = 4;
  local_66b = '\x04';
  local_3c8 = xSize_00;
  local_3b8 = xSize_00;
  local_188 = local_194[2];
  local_184[0] = local_194[2];
  local_17c = local_40c;
  local_178 = local_408;
  local_160 = local_408;
  local_158 = local_408;
  local_150 = local_408;
  local_12c = local_194[2];
  local_114 = local_194[2];
  local_fc = local_194[2];
  local_f4 = local_194[0];
  local_e4 = local_198;
  local_d8 = local_408;
  local_c4 = local_40c;
  local_b0 = local_170;
  local_a4 = local_40c;
  local_98 = local_b8;
  local_90 = local_170;
  do {
    local_3a0 = local_66a;
    local_3a8 = &local_66b;
    if (local_66a[0] == local_66b) {
      return 0;
    }
    local_398 = local_66a;
    local_66c = local_66a[0];
    local_4e4 = FuncFrame::savedRegs
                          ((FuncFrame *)
                           CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978),
                           (RegGroup)((uint)in_stack_fffffffffffff974 >> 0x18));
    local_4e0 = &local_670;
    local_4d0 = &local_670;
    local_670 = local_4e4;
    if (local_4e4 != 0) {
      local_388 = &stack0xfffffffffffff980;
      local_38c = 1;
      local_40 = &local_38c;
      local_44 = 0xff;
      local_24 = 0xff;
      local_28 = 0;
      local_2c = 0;
      uVar3 = 1;
      uVar3 = 0xff;
      in_stack_fffffffffffff97c = 0;
      in_stack_fffffffffffff978 = 0;
      local_38 = local_388;
      local_20 = local_40;
      local_18 = local_388;
      EVar2 = X86Internal_setupSaveRestoreInfo
                        (in_stack_fffffffffffff9bf,
                         (FuncFrame *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
                         in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,xSize_00);
      if (EVar2 != 0) {
        return EVar2;
      }
      in_stack_fffffffffffff974 = 0;
      do {
        local_4bc = Support::BitWordIterator<unsigned_int>::next
                              ((BitWordIterator<unsigned_int> *)
                               CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
        local_4b8 = &stack0xfffffffffffff980;
        local_368 = local_5a0;
        local_378 = &stack0xfffffffffffff9a0;
        local_380 = &stack0xfffffffffffff980;
        local_36c = in_stack_fffffffffffff97c;
        local_10 = local_380;
        local_8 = local_378;
        EVar2 = BaseEmitter::_emitI(in_stack_fffffffffffff980,in_stack_fffffffffffff97c,
                                    (Operand_ *)
                                    CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
                                    (Operand_ *)
                                    CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
        if (EVar2 != 0) {
          return EVar2;
        }
        local_358 = &stack0xfffffffffffff9a0;
        iVar4 = in_stack_fffffffffffff978 + (int)((ulong)in_stack_fffffffffffff9a8 >> 0x20);
        local_4d8 = &local_670;
        in_stack_fffffffffffff970 = 0;
        local_35c = in_stack_fffffffffffff978;
      } while (local_670 != 0);
    }
    local_350 = local_66a;
    local_66a[0] = local_66a[0] + '\x01';
  } while( true );
}

Assistant:

ASMJIT_FAVOR_SIZE Error EmitHelper::emitProlog(const FuncFrame& frame) {
  Emitter* emitter = _emitter->as<Emitter>();
  uint32_t gpSaved = frame.savedRegs(RegGroup::kGp);

  Gp zsp = emitter->zsp();   // ESP|RSP register.
  Gp zbp = emitter->zbp();   // EBP|RBP register.
  Gp gpReg = zsp;            // General purpose register (temporary).
  Gp saReg = zsp;            // Stack-arguments base pointer.

  // Emit: 'endbr32' or 'endbr64' (indirect branch protection).
  if (frame.hasIndirectBranchProtection()) {
    InstId instId = emitter->is32Bit() ? Inst::kIdEndbr32 : Inst::kIdEndbr64;
    ASMJIT_PROPAGATE(emitter->emit(instId));
  }

  // Emit: 'push zbp'
  //       'mov  zbp, zsp'.
  if (frame.hasPreservedFP()) {
    gpSaved &= ~Support::bitMask(Gp::kIdBp);
    ASMJIT_PROPAGATE(emitter->push(zbp));
    ASMJIT_PROPAGATE(emitter->mov(zbp, zsp));
  }

  // Emit: 'push gp' sequence.
  {
    Support::BitWordIterator<RegMask> it(gpSaved);
    while (it.hasNext()) {
      gpReg.setId(it.next());
      ASMJIT_PROPAGATE(emitter->push(gpReg));
    }
  }

  // Emit: 'mov saReg, zsp'.
  uint32_t saRegId = frame.saRegId();
  if (saRegId != BaseReg::kIdBad && saRegId != Gp::kIdSp) {
    saReg.setId(saRegId);
    if (frame.hasPreservedFP()) {
      if (saRegId != Gp::kIdBp)
        ASMJIT_PROPAGATE(emitter->mov(saReg, zbp));
    }
    else {
      ASMJIT_PROPAGATE(emitter->mov(saReg, zsp));
    }
  }

  // Emit: 'and zsp, StackAlignment'.
  if (frame.hasDynamicAlignment()) {
    ASMJIT_PROPAGATE(emitter->and_(zsp, -int32_t(frame.finalStackAlignment())));
  }

  // Emit: 'sub zsp, StackAdjustment'.
  if (frame.hasStackAdjustment()) {
    ASMJIT_PROPAGATE(emitter->sub(zsp, frame.stackAdjustment()));
  }

  // Emit: 'mov [zsp + DAOffset], saReg'.
  if (frame.hasDynamicAlignment() && frame.hasDAOffset()) {
    Mem saMem = ptr(zsp, int32_t(frame.daOffset()));
    ASMJIT_PROPAGATE(emitter->mov(saMem, saReg));
  }

  // Emit 'movxxx [zsp + X], {[x|y|z]mm, k}'.
  {
    Mem xBase = ptr(zsp, int32_t(frame.extraRegSaveOffset()));

    for (RegGroup group : Support::EnumValues<RegGroup, RegGroup(1), RegGroup::kMaxVirt>{}) {
      Support::BitWordIterator<RegMask> it(frame.savedRegs(group));
      if (it.hasNext()) {
        Reg xReg;
        uint32_t xInst = 0;
        uint32_t xSize = 0;
        ASMJIT_PROPAGATE(X86Internal_setupSaveRestoreInfo(group, frame, xReg, xInst, xSize));
        do {
          xReg.setId(it.next());
          ASMJIT_PROPAGATE(emitter->emit(xInst, xBase, xReg));
          xBase.addOffsetLo32(int32_t(xSize));
        } while (it.hasNext());
      }
    }
  }

  return kErrorOk;
}